

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_visualization.cpp
# Opt level: O1

void __thiscall lumeview::SubsetVisualization::receive_message(SubsetVisualization *this)

{
  Message *in_RSI;
  
  receive_message((SubsetVisualization *)&this[-1].m_refreshRequired,in_RSI);
  return;
}

Assistant:

void SubsetVisualization::
receive_message (const Message& msg)
{
	if (!m_subsetInfo || (msg.subject() != m_subsetInfo.get()))
		return;

	if (auto simsg = dynamic_cast <const SubsetInfoAnnexMessage*> (&msg)) {
		COND_THROW (m_subsetInfo.get() != simsg->subset_info_annex(),
		            "SubsetInfoAnnex instances do not match, even though the subject "
		            "of the message indicates that they should match");

		if (simsg->color_changed ()){
			const index_t si = simsg->subset_index();
			const int stageIndex = m_subsetIndexToStageIndex[si];
			m_renderer.stage_set_color (subset_color (si), stageIndex);
		}
		if (simsg->visibility_changed ())
			m_refreshRequired = true;
	}
}